

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O3

int32 Js::JavascriptConversion::ToInt32_Full(Var aValue,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  int32 iVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  ScriptContext *pSVar9;
  JavascriptBoolean *pJVar10;
  JavascriptString *pJVar11;
  JavascriptTypedNumber<long> *pJVar12;
  JavascriptTypedNumber<unsigned_long> *pJVar13;
  char *message;
  char *error;
  uint lineNumber;
  ulong uVar14;
  int32 T4_32;
  uint uVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double local_58;
  double result;
  ScriptContext *local_48;
  
  bVar3 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3ca,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar3) goto LAB_00a8d967;
    *puVar7 = 0;
  }
  uVar14 = (ulong)aValue & 0xffff000000000000;
  bVar3 = uVar14 != 0x1000000000000;
  bVar16 = ((ulong)aValue & 0x1ffff00000000) == 0x1000000000000;
  local_48 = scriptContext;
  if (bVar16 || bVar3) {
    if (uVar14 == 0x1000000000000) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      goto LAB_00a8d174;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a8d967;
    *puVar7 = 0;
LAB_00a8d174:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3cb,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar4) goto LAB_00a8d967;
    *puVar7 = 0;
  }
  bVar4 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar4) {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    pSVar9 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  }
  else {
    pSVar9 = (ScriptContext *)0x0;
  }
  if (aValue != (Var)0x0) {
    if (bVar16 || bVar3) {
      if (uVar14 == 0x1000000000000) goto LAB_00a8d3f0;
      result = (double)pSVar9;
      if ((ulong)aValue >> 0x32 == 0) goto LAB_00a8d2e2;
      goto switchD_00a8d3d4_caseD_4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a8d967;
    *puVar7 = 0;
LAB_00a8d243:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00a8d271:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,lineNumber,error,message);
    if (bVar3) {
      *puVar7 = 0;
LAB_00a8d3f0:
      return (int32)aValue;
    }
LAB_00a8d967:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  AssertCount = AssertCount + 1;
  result = (double)pSVar9;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                              ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
  if (!bVar4) goto LAB_00a8d967;
  *puVar7 = 0;
LAB_00a8d2e2:
  pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
  if (pRVar8 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00a8d967;
    *puVar7 = 0;
  }
  TVar1 = ((pRVar8->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar4) goto LAB_00a8d967;
    *puVar7 = 0;
  }
  uVar15 = 0;
  switch(TVar1) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    break;
  case TypeIds_Boolean:
LAB_00a8d3d9:
    pJVar10 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    uVar15 = (uint)(pJVar10->value != 0);
    break;
  case TypeIds_FirstNumberType:
    if (!bVar16 && !bVar3) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      goto LAB_00a8d243;
    }
    if (uVar14 == 0x1000000000000) goto LAB_00a8d3f0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    error = "(Is(aValue))";
    message = "Ensure var is actually a \'TaggedInt\'";
    lineNumber = 0x43;
    goto LAB_00a8d271;
  case TypeIds_Number:
switchD_00a8d3d4_caseD_4:
    if ((ulong)aValue >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00a8d967;
      *puVar7 = 0;
    }
    local_58 = (double)((ulong)aValue ^ 0xfffc000000000000);
    goto LAB_00a8d485;
  case TypeIds_Int64Number:
    pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    uVar15 = (uint)pJVar12->m_value;
    break;
  case TypeIds_LastNumberType:
    pJVar13 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    uVar15 = (uint)pJVar13->m_value;
    break;
  case TypeIds_String:
    pJVar11 = UnsafeVarTo<Js::JavascriptString>(aValue);
    bVar3 = JavascriptString::ToDouble(pJVar11,&local_58);
    if (!bVar3) {
      return 0;
    }
LAB_00a8d485:
    uVar15 = (uint)local_58;
    break;
  case TypeIds_Symbol:
    pSVar9 = local_48;
LAB_00a8d57c:
    uVar15 = 0;
    JavascriptError::TryThrowTypeError((ScriptContext *)result,pSVar9,-0x7ff5ec77,(PCWSTR)0x0);
    break;
  default:
    BVar5 = JavascriptOperators::IsObject(aValue);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x3fd,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToInteger32");
      if (!bVar3) goto LAB_00a8d967;
      *puVar7 = 0;
    }
    pSVar9 = local_48;
    aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,local_48);
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a8d967;
      *puVar7 = 0;
    }
    else {
      if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00a8d967;
        *puVar7 = 0;
        goto switchD_00a8d834_caseD_3;
      }
      if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto switchD_00a8d834_caseD_3;
      if ((ulong)aValue >> 0x32 != 0) goto switchD_00a8d834_caseD_4;
    }
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a8d967;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar8->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00a8d967;
      *puVar7 = 0;
    }
    switch(TVar1) {
    case TypeIds_Undefined:
    case TypeIds_Null:
      break;
    case TypeIds_Boolean:
      goto LAB_00a8d3d9;
    case TypeIds_FirstNumberType:
switchD_00a8d834_caseD_3:
      iVar6 = TaggedInt::ToInt32(aValue);
      return iVar6;
    case TypeIds_Number:
switchD_00a8d834_caseD_4:
      dVar17 = JavascriptNumber::GetValue(aValue);
      iVar6 = ToInt32(dVar17);
      return iVar6;
    case TypeIds_Int64Number:
      pJVar12 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      dVar17 = (double)pJVar12->m_value;
      goto LAB_00a8d8e5;
    case TypeIds_LastNumberType:
      pJVar13 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar13->m_value);
      auVar18._8_4_ = (int)(pJVar13->m_value >> 0x20);
      auVar18._12_4_ = 0x45300000;
      dVar17 = (auVar18._0_8_ - 4503599627370496.0) + (auVar18._8_8_ - 1.9342813113834067e+25);
LAB_00a8d8e5:
      iVar6 = JavascriptMath::ToInt32Core(dVar17);
      return iVar6;
    case TypeIds_String:
      pJVar11 = UnsafeVarTo<Js::JavascriptString>(aValue);
      bVar3 = JavascriptString::ToDouble(pJVar11,&local_58);
      uVar15 = 0;
      if (bVar3) {
        uVar15 = ToInt32(local_58);
      }
      break;
    case TypeIds_Symbol:
      goto LAB_00a8d57c;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x429,"(0)",
                                  "wrong call in ToInteger32_Full, no dynamic objects should get here."
                                 );
      if (bVar3) {
        *puVar7 = 0;
        JavascriptError::ThrowError(pSVar9,-0x7ff5fe4a,(PCWSTR)0x0);
      }
      goto LAB_00a8d967;
    }
  }
  return uVar15;
}

Assistant:

int32 JavascriptConversion::ToInt32_Full(Var aValue, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Conv_ToInt32_Full);
        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");

        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        // This is used when TaggedInt's overflow but remain under int32
        // so Number is our most critical case:

        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId == TypeIds_Number)
        {
            return JavascriptMath::ToInt32Core(JavascriptNumber::GetValue(aValue));
        }

        switch (typeId)
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return JavascriptMath::ToInt32Core(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
            aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
        }

        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Number:
            return ToInt32(JavascriptNumber::GetValue(aValue));

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return ToInt32(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here.");
            JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
        }
        JIT_HELPER_END(Conv_ToInt32_Full);
    }